

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::AssemblyContext::recordTypeDefinition(AssemblyContext *this,spv_instruction_t *pInst)

{
  value_type vVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  const_reference pvVar5;
  size_type sVar6;
  DiagnosticStream *pDVar7;
  mapped_type *pmVar8;
  uint uStack_5e4;
  undefined4 uStack_5d8;
  DiagnosticStream local_5d0;
  value_type local_3f4;
  undefined4 uStack_3f0;
  IdTypeClass local_3ec;
  DiagnosticStream local_3e8;
  DiagnosticStream local_210;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::IdType>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::IdType>,_false> local_30;
  value_type local_24;
  spv_instruction_t *psStack_20;
  uint32_t value;
  spv_instruction_t *pInst_local;
  AssemblyContext *this_local;
  
  psStack_20 = pInst;
  pInst_local = (spv_instruction_t *)this;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&pInst->words,1);
  local_24 = *pvVar5;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::IdType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>_>
       ::find(&this->types_,&local_24);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::IdType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>_>
       ::end(&this->types_);
  bVar4 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar4) {
    diagnostic(&local_210,this);
    pDVar7 = DiagnosticStream::operator<<(&local_210,(char (*) [7])0x578f9c);
    pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_24);
    pDVar7 = DiagnosticStream::operator<<
                       (pDVar7,(char (*) [42])" has already been used to generate a type");
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
    DiagnosticStream::~DiagnosticStream(&local_210);
  }
  else {
    if (psStack_20->opcode == OpTypeInt) {
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&psStack_20->words);
      if (sVar6 != 4) {
        diagnostic(&local_3e8,this);
        pDVar7 = DiagnosticStream::operator<<
                           (&local_3e8,(char (*) [30])"Invalid OpTypeInt instruction");
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        DiagnosticStream::~DiagnosticStream(&local_3e8);
        return this_local._4_4_;
      }
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&psStack_20->words,2);
      local_3f4 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&psStack_20->words,3);
      uStack_3f0 = CONCAT31(uStack_3f0._1_3_,*pvVar5 != 0);
      local_3ec = kScalarIntegerType;
      pmVar8 = std::
               unordered_map<unsigned_int,_spvtools::IdType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>_>
               ::operator[](&this->types_,&local_24);
      pmVar8->bitwidth = local_3f4;
      pmVar8->isSigned = (bool)(char)uStack_3f0;
      *(int3 *)&pmVar8->field_0x5 = (int3)((uint)uStack_3f0 >> 8);
      pmVar8->type_class = local_3ec;
    }
    else if (psStack_20->opcode == OpTypeFloat) {
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&psStack_20->words);
      if ((sVar6 != 3) &&
         (sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&psStack_20->words)
         , sVar6 != 4)) {
        diagnostic(&local_5d0,this);
        pDVar7 = DiagnosticStream::operator<<
                           (&local_5d0,(char (*) [32])"Invalid OpTypeFloat instruction");
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        DiagnosticStream::~DiagnosticStream(&local_5d0);
        return this_local._4_4_;
      }
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&psStack_20->words,2);
      vVar1 = *pvVar5;
      pmVar8 = std::
               unordered_map<unsigned_int,_spvtools::IdType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>_>
               ::operator[](&this->types_,&local_24);
      uVar3 = CONCAT44(uStack_5d8,vVar1) & 0xffffff00ffffffff;
      pmVar8->bitwidth = (int)uVar3;
      pmVar8->isSigned = (bool)(char)(uVar3 >> 0x20);
      *(int3 *)&pmVar8->field_0x5 = (int3)(uVar3 >> 0x28);
      pmVar8->type_class = kScalarFloatType;
    }
    else {
      uStack_5e4 = uStack_5e4 & 0xffffff00;
      pmVar8 = std::
               unordered_map<unsigned_int,_spvtools::IdType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>_>
               ::operator[](&this->types_,&local_24);
      lVar2 = (ulong)uStack_5e4 << 0x20;
      pmVar8->bitwidth = (int)lVar2;
      pmVar8->isSigned = (bool)(char)((ulong)lVar2 >> 0x20);
      *(int3 *)&pmVar8->field_0x5 = (int3)((ulong)lVar2 >> 0x28);
      pmVar8->type_class = kOtherType;
    }
    this_local._4_4_ = SPV_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t AssemblyContext::recordTypeDefinition(
    const spv_instruction_t* pInst) {
  uint32_t value = pInst->words[1];
  if (types_.find(value) != types_.end()) {
    return diagnostic() << "Value " << value
                        << " has already been used to generate a type";
  }

  if (pInst->opcode == spv::Op::OpTypeInt) {
    if (pInst->words.size() != 4)
      return diagnostic() << "Invalid OpTypeInt instruction";
    types_[value] = {pInst->words[2], pInst->words[3] != 0,
                     IdTypeClass::kScalarIntegerType};
  } else if (pInst->opcode == spv::Op::OpTypeFloat) {
    if ((pInst->words.size() != 3) && (pInst->words.size() != 4))
      return diagnostic() << "Invalid OpTypeFloat instruction";
    // TODO(kpet) Do we need to record the FP Encoding here?
    types_[value] = {pInst->words[2], false, IdTypeClass::kScalarFloatType};
  } else {
    types_[value] = {0, false, IdTypeClass::kOtherType};
  }
  return SPV_SUCCESS;
}